

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedPreciseMeasurement_doubleOps_Test::TestBody(fixedPreciseMeasurement_doubleOps_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  double dVar3;
  AssertHelper local_3f0;
  Message local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_10;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_9;
  precise_measurement local_3a0;
  AssertHelper local_388;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_350 [8];
  fixed_precise_measurement y;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_7;
  fixed_precise_measurement fp4;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_6;
  fixed_precise_measurement fp3;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_5;
  fixed_precise_measurement fp2;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_4;
  fixed_precise_measurement fp1;
  AssertHelper local_238;
  Message local_230;
  precise_measurement local_228;
  precise_measurement local_210;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1c0;
  Message local_1b8;
  precise_measurement local_1b0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__1;
  fixed_precise_measurement f1;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  fixed_precise_measurement f3;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  fixed_precise_measurement f4;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  bool res;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  fixed_precise_measurement freq2;
  Message local_70 [3];
  precise_unit local_58;
  precise_unit local_48;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  fixed_precise_measurement freq;
  fixedPreciseMeasurement_doubleOps_Test *this_local;
  
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)&gtest_ar.message_,9.0,(precise_unit *)units::precise::Hz)
  ;
  local_48 = units::fixed_precise_measurement::units
                       ((fixed_precise_measurement *)&gtest_ar.message_);
  local_58 = units::precise_unit::operator/
                       ((precise_unit *)units::precise::one,(precise_unit *)units::precise::s);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_38,"freq.units()","precise::one / precise::s",&local_48,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&freq2.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x33a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&freq2.units_.base_units_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&freq2.units_.base_units_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  units::operator*((fixed_precise_measurement *)&gtest_ar_1.message_,2.0,
                   (fixed_precise_measurement *)&gtest_ar.message_);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_1.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"freq2.value()","18.0",dVar3,18.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x33c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff50,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c8,
             (bool *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&f4.units_.base_units_,(internal *)local_c8,(AssertionResult *)0x200651,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x33e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&f4.units_.base_units_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  units::fixed_precise_measurement::operator*
            ((fixed_precise_measurement *)&gtest_ar_2.message_,
             (fixed_precise_measurement *)&gtest_ar.message_,3.0);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_2.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_120,"f4.value()","27.0",dVar3,27.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&f3.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x341,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&f3.units_.base_units_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&f3.units_.base_units_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  units::fixed_precise_measurement::operator/
            ((fixed_precise_measurement *)&gtest_ar_3.message_,
             (fixed_precise_measurement *)&gtest_ar.message_,3.0);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_3.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_158,"static_cast<float>(f3.value())","3.0",(double)(float)dVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&f1.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x344,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&f1.units_.base_units_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&f1.units_.base_units_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  units::operator/((fixed_precise_measurement *)&gtest_ar__1.message_,9.0,
                   (fixed_precise_measurement *)&gtest_ar.message_);
  units::operator*(&local_1b0,1.0,(precise_unit *)units::precise::s);
  local_191 = units::fixed_precise_measurement::operator==
                        ((fixed_precise_measurement *)&gtest_ar__1.message_,&local_1b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_190,
               (AssertionResult *)"f1 == (1.0 * precise::s)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x347,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  units::operator*(&local_210,1.0,(precise_unit *)units::precise::s);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_228,(fixed_precise_measurement *)&gtest_ar__1.message_);
  local_1f1 = units::precise_measurement::operator==(&local_210,&local_228);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fp1.units_.base_units_,(internal *)local_1f0,
               (AssertionResult *)"(1.0 * precise::s) == f1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x348,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&fp1.units_.base_units_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  units::fixed_precise_measurement::operator+
            ((fixed_precise_measurement *)&gtest_ar_4.message_,
             (fixed_precise_measurement *)&gtest_ar.message_,3.0);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_4.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_280,"fp1.value()","12.0",dVar3,12.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fp2.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x34b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fp2.units_.base_units_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fp2.units_.base_units_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  units::operator+((fixed_precise_measurement *)&gtest_ar_5.message_,3.0,
                   (fixed_precise_measurement *)&gtest_ar.message_);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_5.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2b8,"fp2.value()","12.0",dVar3,12.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fp3.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x34e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fp3.units_.base_units_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fp3.units_.base_units_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  units::fixed_precise_measurement::operator-
            ((fixed_precise_measurement *)&gtest_ar_6.message_,
             (fixed_precise_measurement *)&gtest_ar.message_,3.0);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_6.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2f0,"fp3.value()","6.0",dVar3,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fp4.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x351,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fp4.units_.base_units_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fp4.units_.base_units_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  units::operator-((fixed_precise_measurement *)&gtest_ar_7.message_,12.0,
                   (fixed_precise_measurement *)&gtest_ar.message_);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_7.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_328,"fp4.value()","3.0",dVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x354,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y.units_.base_units_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y.units_.base_units_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  units::operator*((precise_measurement *)&gtest_ar_8.message_,2.0,(precise_unit *)units::precise::m
                  );
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)local_350,(precise_measurement *)&gtest_ar_8.message_);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_350);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_378,"y.value()","2.0",dVar3,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x357,pcVar2);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  join_0x00000000_0x00001200_ = units::operator*(5.0,(unit *)&units::m);
  units::precise_measurement::precise_measurement(&local_3a0,(measurement *)&gtest_ar_9.message_);
  units::fixed_precise_measurement::operator=((fixed_precise_measurement *)local_350,&local_3a0);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_350);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3c0,"y.value()","5.0",dVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x359,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  units::fixed_precise_measurement::operator=((fixed_precise_measurement *)local_350,7.0);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_350);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3e0,"y.value()","7.0",dVar3,7.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x35b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, doubleOps)
{
    fixed_precise_measurement freq(9.0, precise::Hz);
    EXPECT_EQ(freq.units(), precise::one / precise::s);
    auto freq2 = 2.0 * freq;
    EXPECT_DOUBLE_EQ(freq2.value(), 18.0);
    bool res = std::is_same<decltype(freq), decltype(freq2)>::value;
    EXPECT_TRUE(res);

    auto f4 = freq * 3;
    EXPECT_DOUBLE_EQ(f4.value(), 27.0);

    auto f3 = freq / 3;
    EXPECT_DOUBLE_EQ(static_cast<float>(f3.value()), 3.0);

    auto f1 = 9.0 / freq;
    EXPECT_TRUE(f1 == (1.0 * precise::s));
    EXPECT_TRUE((1.0 * precise::s) == f1);

    auto fp1 = freq + 3.0;
    EXPECT_DOUBLE_EQ(fp1.value(), 12.0);

    auto fp2 = 3.0 + freq;
    EXPECT_DOUBLE_EQ(fp2.value(), 12.0);

    auto fp3 = freq - 3.0;
    EXPECT_DOUBLE_EQ(fp3.value(), 6.0);

    auto fp4 = 12.0 - freq;
    EXPECT_DOUBLE_EQ(fp4.value(), 3.0);

    fixed_precise_measurement y(2.0 * precise::m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
}